

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::EmitEndMap(Emitter *this)

{
  bool bVar1;
  value vVar2;
  size_t sVar3;
  pointer pEVar4;
  EmitterState *in_RDI;
  value originalType;
  value in_stack_000000fc;
  EmitterState *in_stack_00000100;
  char (*in_stack_ffffffffffffffd8) [2];
  string *indent;
  IndentTo local_18;
  value local_c;
  
  bVar1 = good((Emitter *)0xef7a18);
  if (bVar1) {
    std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
              ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7a2b)
    ;
    local_c = EmitterState::CurGroupFlowType(in_RDI);
    std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
              ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7a41)
    ;
    sVar3 = EmitterState::CurGroupChildCount(in_RDI);
    if (sVar3 == 0) {
      std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                 0xef7a59);
      EmitterState::ForceFlow(in_RDI);
    }
    std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
              ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7a6b)
    ;
    vVar2 = EmitterState::CurGroupFlowType(in_RDI);
    if (vVar2 == Flow) {
      bVar1 = ostream_wrapper::comment((ostream_wrapper *)&in_RDI->m_lastError);
      if (bVar1) {
        YAML::operator<<((ostream_wrapper *)in_RDI,in_stack_ffffffffffffffd8);
      }
      indent = &in_RDI->m_lastError;
      pEVar4 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
               operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                           *)0xef7aba);
      sVar3 = EmitterState::CurIndent(pEVar4);
      IndentTo::IndentTo(&local_18,sVar3);
      YAML::operator<<((ostream_wrapper *)in_RDI,(IndentTo *)indent);
      if (local_c == Block) {
        YAML::operator<<((ostream_wrapper *)in_RDI,(char (*) [2])indent);
      }
      else {
        std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                  ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                   0xef7b05);
        sVar3 = EmitterState::CurGroupChildCount(in_RDI);
        if (sVar3 == 0) {
          pEVar4 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
                   operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                               *)0xef7b1d);
          bVar1 = EmitterState::HasBegunNode(pEVar4);
          if (!bVar1) {
            YAML::operator<<((ostream_wrapper *)in_RDI,(char (*) [2])indent);
          }
        }
      }
      YAML::operator<<((ostream_wrapper *)in_RDI,(char (*) [2])indent);
    }
    std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
              ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7b5f)
    ;
    EmitterState::EndedGroup(in_stack_00000100,in_stack_000000fc);
  }
  return;
}

Assistant:

void Emitter::EmitEndMap() {
  if (!good())
    return;
  FlowType::value originalType = m_pState->CurGroupFlowType();

  if (m_pState->CurGroupChildCount() == 0)
    m_pState->ForceFlow();

  if (m_pState->CurGroupFlowType() == FlowType::Flow) {
    if (m_stream.comment())
      m_stream << "\n";
    m_stream << IndentTo(m_pState->CurIndent());
    if (originalType == FlowType::Block) {
      m_stream << "{";
    } else {
      if (m_pState->CurGroupChildCount() == 0 && !m_pState->HasBegunNode())
        m_stream << "{";
    }
    m_stream << "}";
  }

  m_pState->EndedGroup(GroupType::Map);
}